

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCC.h
# Opt level: O2

void __thiscall dg::SCC<dg::pta::PSNode>::SCC(SCC<dg::pta::PSNode> *this)

{
  std::stack<dg::pta::PSNode*,std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>::
  stack<std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,void>
            ((stack<dg::pta::PSNode_*,_std::deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              *)this);
  (this->_info).
  super_unordered_map<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::SCC<dg::pta::PSNode>::NodeInfo>_>_>
  ._M_h._M_buckets =
       &(this->_info).
        super_unordered_map<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::SCC<dg::pta::PSNode>::NodeInfo>_>_>
        ._M_h._M_single_bucket;
  (this->_info).
  super_unordered_map<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::SCC<dg::pta::PSNode>::NodeInfo>_>_>
  ._M_h._M_bucket_count = 1;
  (this->_info).
  super_unordered_map<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::SCC<dg::pta::PSNode>::NodeInfo>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_info).
  super_unordered_map<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::SCC<dg::pta::PSNode>::NodeInfo>_>_>
  ._M_h._M_element_count = 0;
  (this->_info).
  super_unordered_map<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::SCC<dg::pta::PSNode>::NodeInfo>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scc).
  super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scc).
  super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scc).
  super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_info).
  super_unordered_map<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::SCC<dg::pta::PSNode>::NodeInfo>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_info).
  super_unordered_map<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::SCC<dg::pta::PSNode>::NodeInfo>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_info)._cache[0].first = (PSNode *)0x0;
  (this->_info)._cache[0].second = (NodeInfo *)0x0;
  (this->_info)._cache[1].first = (PSNode *)0x0;
  (this->_info)._cache[1].second = (NodeInfo *)0x0;
  (this->_info)._cache[2].first = (PSNode *)0x0;
  (this->_info)._cache[2].second = (NodeInfo *)0x0;
  (this->_info)._cache[3].first = (PSNode *)0x0;
  (this->_info)._cache[3].second = (NodeInfo *)0x0;
  *(undefined8 *)((long)&(this->_info)._cache[3].second + 4) = 0;
  *(undefined8 *)&(this->_info)._last = 0;
  return;
}

Assistant:

SCC<NodeT>() = default;